

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

common_chat_msg *
common_chat_parse_llama_3_1
          (common_chat_msg *__return_storage_ptr__,string *input,bool with_builtin_tools)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  undefined8 *puVar4;
  common_chat_msg *extraout_RAX;
  common_chat_msg *extraout_RAX_00;
  common_chat_msg *extraout_RAX_01;
  common_chat_msg *pcVar5;
  common_chat_msg *extraout_RAX_02;
  long lVar6;
  data *this;
  initializer_list_t init;
  initializer_list_t init_00;
  string_type arg_value_str;
  string_type arg_name;
  smatch match;
  string_type name;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  arg_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  long local_158;
  undefined8 uStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138;
  undefined7 uStack_137;
  data local_120;
  data local_110;
  undefined1 local_100 [32];
  bool local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_a0;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_60;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_48;
  undefined8 local_38;
  
  if ((common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::function_regex_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                                   function_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                function_regex_abi_cxx11_,
               "\\s*\\{\\s*(?:\"type\"\\s*:\\s*\"function\"\\s*,\\s*)?\"name\"\\s*:\\s*\"([^\"]+)\"\\s*,\\s*\"parameters\"\\s*: "
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                  function_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                         function_regex_abi_cxx11_);
  }
  if ((common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::close_regex_abi_cxx11_ == '\0'
      ) && (iVar3 = __cxa_guard_acquire(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)
                                         ::close_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                close_regex_abi_cxx11_,"\\}\\s*",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                  close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                         close_regex_abi_cxx11_);
  }
  if ((common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::builtin_call_regex_abi_cxx11_
       == '\0') &&
     (iVar3 = __cxa_guard_acquire(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                                   builtin_call_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                builtin_call_regex_abi_cxx11_,
               "<\\|python_tag\\|>\\s*([^.(]+)\\s*\\.\\s*call\\s*\\(\\s*([\\w]+)\\s*=\\s*([\\s\\S]*?)\\)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                  builtin_call_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                         builtin_call_regex_abi_cxx11_);
  }
  if (with_builtin_tools) {
    local_158 = 0;
    uStack_150 = 0;
    local_168._M_allocated_capacity = 0;
    local_168._8_8_ = (void *)0x0;
    __s._M_current = (input->_M_dataplus)._M_p;
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(__s._M_current + input->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&local_168,
                       &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                        builtin_call_regex_abi_cxx11_,0);
    pcVar5 = (common_chat_msg *)CONCAT71(extraout_var,bVar2);
    bVar1 = true;
    if (bVar2) {
      lVar6 = local_168._8_8_ - local_168._0_8_;
      if ((lVar6 == 0) || (0xfffffffffffffffd < (lVar6 >> 3) * -0x5555555555555555 - 5U)) {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + lVar6 + -0x48);
      }
      else {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + 0x18);
      }
      local_148._M_allocated_capacity = (size_type)&local_138;
      if (*(char *)(puVar4 + 2) == '\x01') {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_148,*puVar4,puVar4[1]);
        lVar6 = local_168._8_8_ - local_168._0_8_;
      }
      else {
        local_148._8_8_ = 0;
        local_138 = 0;
      }
      if ((local_168._M_allocated_capacity == local_168._8_8_) ||
         (0xfffffffffffffffc < (lVar6 >> 3) * -0x5555555555555555 - 6U)) {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + lVar6 + -0x48);
      }
      else {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + 0x30);
      }
      local_188._0_8_ = local_188 + 0x10;
      if (*(char *)(puVar4 + 2) == '\x01') {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_188,*puVar4,puVar4[1]);
        lVar6 = local_168._8_8_ - local_168._0_8_;
      }
      else {
        local_188._8_8_ = 0;
        local_188[0x10] = '\0';
      }
      if ((local_168._M_allocated_capacity == local_168._8_8_) ||
         (0xfffffffffffffffb < (lVar6 >> 3) * -0x5555555555555555 - 7U)) {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + lVar6 + -0x48);
      }
      else {
        puVar4 = (undefined8 *)(local_168._M_allocated_capacity + 0x48);
      }
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      if (*(char *)(puVar4 + 2) == '\x01') {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_1a8,*puVar4,puVar4[1]);
      }
      else {
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_local_buf[0] = '\0';
      }
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (code *)0x0;
      uStack_70 = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::__cxx11::string&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&local_110,&local_1a8,(parser_callback_t *)&local_88,true,false);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      (__return_storage_ptr__->role)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->role).field_2;
      (__return_storage_ptr__->role)._M_string_length = 0;
      (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->content)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->content).field_2;
      (__return_storage_ptr__->content)._M_string_length = 0;
      (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
      (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
      (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->tool_name).field_2;
      (__return_storage_ptr__->tool_name)._M_string_length = 0;
      (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
      (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
      (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x221b57);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_148._M_allocated_capacity,
                 (undefined1 *)(local_148._8_8_ + local_148._M_allocated_capacity));
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_60.owned_value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      local_60.value_ref = (value_type *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&local_48,
                   (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_110);
      local_38 = 0;
      init._M_len = 2;
      init._M_array = &local_60;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&local_a0.owned_value,init,true,array);
      local_a0.value_ref = (value_type *)0x0;
      init_00._M_len = 1;
      init_00._M_array = &local_a0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_120,init_00,true,array);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump((string_t *)local_e0,
             (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_120,-1,' ',false,strict);
      local_c0._M_p = (pointer)&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
      std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
      emplace_back<common_chat_tool_call>
                (&__return_storage_ptr__->tool_calls,(common_chat_tool_call *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._0_8_ + 1);
      }
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_120,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_120);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant(&local_a0.owned_value,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_a0);
      lVar6 = 0x18;
      do {
        this = (data *)(&local_60.owned_value.m_data.m_type + lVar6);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)this,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(this);
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != -0x18);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_110,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      pcVar5 = (common_chat_msg *)(local_188 + 0x10);
      if ((common_chat_msg *)local_188._0_8_ != pcVar5) {
        operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
        pcVar5 = extraout_RAX;
      }
      if ((undefined1 *)local_148._M_allocated_capacity != &local_138) {
        operator_delete((void *)local_148._M_allocated_capacity,CONCAT71(uStack_137,local_138) + 1);
        pcVar5 = extraout_RAX_00;
      }
      bVar1 = false;
    }
    if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_168._M_allocated_capacity,local_158 - local_168._0_8_);
      pcVar5 = extraout_RAX_01;
    }
    if (!bVar1) {
      return pcVar5;
    }
  }
  local_e0[0] = false;
  pcVar5 = parse_json_tool_calls
                     (__return_storage_ptr__,input,
                      (optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>
                       *)local_100,
                      &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                       function_regex_abi_cxx11_,
                      &common_chat_parse_llama_3_1(std::__cxx11::string_const&,bool)::
                       close_regex_abi_cxx11_,false);
  if (local_e0[0] == true) {
    local_e0[0] = false;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_100);
    pcVar5 = extraout_RAX_02;
  }
  return pcVar5;
}

Assistant:

static common_chat_msg common_chat_parse_llama_3_1(const std::string & input, bool with_builtin_tools = false) {
    // TODO: tighten & simplify the parser, don't accept leading text context.
    static const std::regex function_regex(
        "\\s*\\{\\s*(?:\"type\"\\s*:\\s*\"function\"\\s*,\\s*)?\"name\"\\s*:\\s*\"([^\"]+)\"\\s*,\\s*\"parameters\"\\s*: ");
    static const std::regex close_regex("\\}\\s*");
    static const std::regex builtin_call_regex("<\\|python_tag\\|>\\s*([^.(]+)\\s*\\.\\s*call\\s*\\(\\s*([\\w]+)\\s*=\\s*([\\s\\S]*?)\\)");

    if (with_builtin_tools) {
        std::smatch match;
        if (std::regex_match(input, match, builtin_call_regex)) {
            try {
                auto name = match[1].str();
                auto arg_name = match[2].str();
                auto arg_value_str = match[3].str();
                auto arg_value = json::parse(arg_value_str);

                common_chat_msg msg;
                msg.role = "assistant";
                msg.tool_calls.push_back({
                    /* .name = */ name,
                    /* .arguments = */ (json {
                        {arg_name, arg_value},
                    }).dump(),
                    /* .id = */ "",
                });
                return msg;
            } catch (const std::exception & e) {
                LOG_WRN("Failed to parse builtin tool call arguments (%s): %s", e.what(), input.c_str());
            }
        }
    }
    return parse_json_tool_calls(input, std::nullopt, function_regex, close_regex);
}